

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  fout f_00;
  fout *pfVar3;
  char cVar4;
  int iVar5;
  rnndb *db;
  size_t sVar6;
  char *pcVar7;
  FILE *pFVar8;
  ushort **ppuVar9;
  __int32_t **pp_Var10;
  rnnenum *prVar11;
  rnnbitset *prVar12;
  rnndomain *prVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  fout f;
  
  if (argc < 2) {
LAB_001030ec:
    main_cold_2();
    xmlCheckVersion(0x51b1);
    iVar5 = xmlInitParser();
    return iVar5;
  }
  rnn_init();
  db = rnn_newdb();
  rnn_parsefile(db,argv[1]);
  rnn_prepdb(db);
  if (0 < db->filesnum) {
    lVar16 = 0;
    do {
      pcVar2 = db->files[lVar16];
      sVar6 = strlen(pcVar2);
      pcVar7 = (char *)malloc(sVar6 + 3);
      strcpy(pcVar7,pcVar2);
      sVar6 = strlen(pcVar7);
      (pcVar7 + sVar6)[0] = '.';
      (pcVar7 + sVar6)[1] = 'h';
      pcVar7[sVar6 + 2] = '\0';
      pcVar2 = db->files[lVar16];
      pFVar8 = fopen(pcVar7,"w");
      if (pFVar8 == (FILE *)0x0) {
        main_cold_1();
        goto LAB_001030ec;
      }
      free(pcVar7);
      pcVar7 = strdup(pcVar2);
      if (*pcVar7 != '\0') {
        ppuVar9 = __ctype_b_loc();
        uVar15 = 0;
        do {
          cVar1 = pcVar7[uVar15];
          cVar4 = '_';
          if (((*ppuVar9)[cVar1] & 8) != 0) {
            pp_Var10 = __ctype_toupper_loc();
            cVar4 = (char)(*pp_Var10)[cVar1];
          }
          pcVar7[uVar15] = cVar4;
          uVar15 = uVar15 + 1;
          sVar6 = strlen(pcVar7);
        } while (uVar15 < sVar6);
      }
      if (foutsmax <= foutsnum) {
        iVar5 = foutsmax * 2;
        if (foutsmax == 0) {
          iVar5 = 0x10;
        }
        foutsmax = iVar5;
        fouts = (fout *)realloc(fouts,(long)iVar5 * 0x18);
      }
      pfVar3 = fouts;
      lVar14 = (long)foutsnum;
      foutsnum = foutsnum + 1;
      fouts[lVar14].guard = pcVar7;
      pfVar3[lVar14].name = pcVar2;
      pfVar3[lVar14].file = (FILE *)pFVar8;
      f_00.file = (FILE *)pFVar8;
      f_00.name = pcVar2;
      f_00.guard = pcVar7;
      printhead(f_00,db);
      lVar16 = lVar16 + 1;
    } while (lVar16 < db->filesnum);
  }
  if (0 < db->enumsnum) {
    lVar16 = 0;
    do {
      if ((db->enums[lVar16]->isinline == 0) && (prVar11 = db->enums[lVar16], 0 < prVar11->valsnum))
      {
        lVar14 = 0;
        do {
          printvalue(prVar11->vals[lVar14],0);
          lVar14 = lVar14 + 1;
          prVar11 = db->enums[lVar16];
        } while (lVar14 < prVar11->valsnum);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < db->enumsnum);
  }
  if (0 < db->bitsetsnum) {
    lVar16 = 0;
    do {
      if ((db->bitsets[lVar16]->isinline == 0) &&
         (prVar12 = db->bitsets[lVar16], 0 < prVar12->bitfieldsnum)) {
        lVar14 = 0;
        do {
          printbitfield(prVar12->bitfields[lVar14],0);
          lVar14 = lVar14 + 1;
          prVar12 = db->bitsets[lVar16];
        } while (lVar14 < prVar12->bitfieldsnum);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < db->bitsetsnum);
  }
  if (0 < db->domainsnum) {
    lVar16 = 0;
    do {
      prVar13 = db->domains[lVar16];
      if (prVar13->size != 0) {
        printdef(prVar13->fullname,"SIZE",0,prVar13->size,prVar13->file);
      }
      prVar13 = db->domains[lVar16];
      if (0 < prVar13->subelemsnum) {
        lVar14 = 0;
        do {
          printdelem(prVar13->subelems[lVar14],0);
          lVar14 = lVar14 + 1;
          prVar13 = db->domains[lVar16];
        } while (lVar14 < prVar13->subelemsnum);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < db->domainsnum);
  }
  if (0 < foutsnum) {
    lVar14 = 0x10;
    lVar16 = 0;
    do {
      fprintf(*(FILE **)((long)fouts + lVar14 + -8),"\n#endif /* %s */\n",
              *(undefined8 *)((long)&fouts->name + lVar14));
      lVar16 = lVar16 + 1;
      lVar14 = lVar14 + 0x18;
    } while (lVar16 < foutsnum);
  }
  return db->estatus;
}

Assistant:

int main(int argc, char **argv) {
	struct rnndb *db;
	int i, j;

	if (argc < 2) {
		fprintf(stderr, "Usage:\n\theadergen database-file\n");
		exit(1);
	}

	rnn_init();
	db = rnn_newdb();
	rnn_parsefile (db, argv[1]);
	rnn_prepdb (db);
	for(i = 0; i < db->filesnum; ++i) {
		char *dstname = malloc(strlen(db->files[i]) + 3);
		strcpy(dstname, db->files[i]);
		strcat(dstname, ".h");
		struct fout f = { db->files[i], fopen(dstname, "w") };
		if (!f.file) {
			perror(dstname);
			exit(1);
		}
		free(dstname);
		f.guard = strdup(f.name);
		for (j = 0; j < strlen(f.guard); j++)
			if (isalnum(f.guard[j]))
				f.guard[j] = toupper(f.guard[j]);
			else
				f.guard[j] = '_';
		ADDARRAY(fouts, f);
		printhead(f, db);
	}

	for (i = 0; i < db->enumsnum; i++) {
		if (db->enums[i]->isinline)
			continue;
		int j;
		for (j = 0; j < db->enums[i]->valsnum; j++)
			printvalue (db->enums[i]->vals[j], 0);
	}
	for (i = 0; i < db->bitsetsnum; i++) {
		if (db->bitsets[i]->isinline)
			continue;
		int j;
		for (j = 0; j < db->bitsets[i]->bitfieldsnum; j++)
			printbitfield (db->bitsets[i]->bitfields[j], 0);
	}
	for (i = 0; i < db->domainsnum; i++) {
		if (db->domains[i]->size)
			printdef (db->domains[i]->fullname, "SIZE", 0, db->domains[i]->size, db->domains[i]->file);
		int j;
		for (j = 0; j < db->domains[i]->subelemsnum; j++) {
			printdelem(db->domains[i]->subelems[j], 0);
		}
	}
	for(i = 0; i < foutsnum; ++i) {
		fprintf (fouts[i].file, "\n#endif /* %s */\n", fouts[i].guard);
	}
	return db->estatus;
}